

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O1

void __thiscall Assimp::FBX::AnimationCurve::~AnimationCurve(AnimationCurve *this)

{
  pointer puVar1;
  pointer pfVar2;
  pointer plVar3;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationCurve_00259df0;
  puVar1 = (this->flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pfVar2 = (this->attributes).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2);
  }
  pfVar2 = (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2);
  }
  plVar3 = (this->keys).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar3 != (pointer)0x0) {
    operator_delete(plVar3);
  }
  Object::~Object(&this->super_Object);
  return;
}

Assistant:

AnimationCurve::~AnimationCurve()
{
    // empty
}